

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QKeyCombination>::assign<QKeyCombination_const*,q20::identity>
          (QArrayDataPointer<QKeyCombination> *this,int *first,int *last)

{
  Data *pDVar1;
  QArrayData *pQVar2;
  QKeyCombination *__cur;
  QKeyCombination *pQVar3;
  QKeyCombination *pQVar4;
  QKeyCombination *pQVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = (long)last - (long)first >> 2;
  pDVar1 = this->d;
  if (pDVar1 == (Data *)0x0) {
LAB_0041642d:
    local_30 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = (QKeyCombination *)QArrayData::allocate(&local_30,4,0x10,lVar6,KeepSize);
    pQVar2 = &this->d->super_QArrayData;
    this->d = (Data *)local_30;
    this->ptr = pQVar3;
    this->size = 0;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,4,0x10);
      }
    }
  }
  else {
    if (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) {
LAB_00416415:
      if (pDVar1 != (Data *)0x0) {
        lVar7 = (pDVar1->super_QArrayData).alloc;
        if (lVar7 <= lVar6) {
          lVar7 = lVar6;
        }
        if (((pDVar1->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
             super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) {
          lVar6 = lVar7;
        }
      }
      goto LAB_0041642d;
    }
    if (pDVar1 == (Data *)0x0) {
      lVar7 = 0;
    }
    else {
      lVar7 = (pDVar1->super_QArrayData).alloc;
    }
    if (lVar7 < lVar6) goto LAB_00416415;
  }
  if (this->d == (Data *)0x0) {
    lVar6 = 0;
  }
  else {
    lVar6 = (long)((long)this->ptr -
                  ((ulong)((long)&this->d[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >>
            2;
  }
  pQVar3 = this->ptr;
  lVar7 = this->size;
  pQVar5 = pQVar3 + -lVar6;
  pQVar4 = pQVar5;
  if (lVar6 != 0) {
    this->ptr = pQVar5;
    lVar8 = lVar6 * -4;
    do {
      if (first == last) {
        pQVar4 = (QKeyCombination *)((long)&pQVar3->combination + lVar8);
        goto LAB_0041652b;
      }
      *(int *)((long)&pQVar3->combination + lVar8) = *first;
      first = first + 1;
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0);
    this->size = lVar6 + lVar7;
    pQVar4 = pQVar3;
  }
  if (first != last) {
    do {
      if (pQVar4 == pQVar3 + lVar7) goto LAB_0041650d;
      pQVar4->combination = *first;
      pQVar4 = pQVar4 + 1;
      first = first + 1;
    } while (first != last);
  }
LAB_0041651f:
  pQVar5 = this->ptr;
LAB_0041652b:
  this->size = (long)pQVar4 - (long)pQVar5 >> 2;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
LAB_0041650d:
  do {
    pQVar4->combination = *first;
    first = first + 1;
    pQVar4 = pQVar4 + 1;
  } while (first != last);
  goto LAB_0041651f;
}

Assistant:

void assign(InputIterator first, InputIterator last, Projection proj = {})
    {
        // This function only provides the basic exception guarantee.
        constexpr bool IsFwdIt = std::is_convertible_v<
                typename std::iterator_traits<InputIterator>::iterator_category,
                std::forward_iterator_tag>;
        constexpr bool IsIdentity = std::is_same_v<Projection, q20::identity>;

        if constexpr (IsFwdIt) {
            const qsizetype n = std::distance(first, last);
            if (needsDetach() || n > constAllocatedCapacity()) {
                QArrayDataPointer allocated(detachCapacity(n));
                swap(allocated);
            }
        } else if (needsDetach()) {
            QArrayDataPointer allocated(allocatedCapacity());
            swap(allocated);
            // We don't want to copy data that we know we'll overwrite
        }

        auto offset = freeSpaceAtBegin();
        const auto capacityBegin = begin() - offset;
        const auto prependBufferEnd = begin();

        if constexpr (!std::is_nothrow_constructible_v<T, decltype(std::invoke(proj, *first))>) {
            // If construction can throw, and we have freeSpaceAtBegin(),
            // it's easiest to just clear the container and start fresh.
            // The alternative would be to keep track of two active, disjoint ranges.
            if (offset) {
                (*this)->truncate(0);
                setBegin(capacityBegin);
                offset = 0;
            }
        }

        auto dst = capacityBegin;
        const auto dend = end();
        if (offset) { // avoids dead stores
            setBegin(capacityBegin); // undo prepend optimization

            // By construction, the following loop is nothrow!
            // (otherwise, we can't reach here)
            // Assumes InputIterator operations don't throw.
            // (but we can't statically assert that, as these operations
            //  have preconditons, so typically aren't noexcept)
            while (true) {
                if (dst == prependBufferEnd) {  // ran out of prepend buffer space
                    size += offset;
                    // we now have a contiguous buffer, continue with the main loop:
                    break;
                }
                if (first == last) {            // ran out of elements to assign
                    std::destroy(prependBufferEnd, dend);
                    size = dst - begin();
                    return;
                }
                // construct element in prepend buffer
                q20::construct_at(dst, std::invoke(proj, *first));
                ++dst;
                ++first;
            }
        }

        while (true) {
            if (first == last) {    // ran out of elements to assign
                std::destroy(dst, dend);
                break;
            }
            if (dst == dend) {      // ran out of existing elements to overwrite
                if constexpr (IsFwdIt && IsIdentity) {
                    dst = std::uninitialized_copy(first, last, dst);
                    break;
                } else if constexpr (IsFwdIt && !IsIdentity
                           && std::is_nothrow_constructible_v<T, decltype(std::invoke(proj, *first))>) {
                    for (; first != last; ++dst, ++first)   // uninitialized_copy with projection
                        q20::construct_at(dst, std::invoke(proj, *first));
                    break;
                } else {
                    do {
                        (*this)->emplace(size, std::invoke(proj, *first));
                    } while (++first != last);
                    return;         // size() is already correct (and dst invalidated)!
                }
            }
            *dst = std::invoke(proj, *first);    // overwrite existing element
            ++dst;
            ++first;
        }
        size = dst - begin();
    }